

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_0::ReverseKeyComparator::FindShortestSeparator
          (ReverseKeyComparator *this,string *start,Slice *limit)

{
  Comparator *pCVar1;
  Slice *key;
  Slice *key_00;
  string l;
  string s;
  string local_80;
  string local_60;
  string local_40;
  pointer local_20;
  size_type sStack_18;
  
  local_80._M_dataplus._M_p = (start->_M_dataplus)._M_p;
  local_80._M_string_length = start->_M_string_length;
  Reverse_abi_cxx11_(&local_60,(leveldb *)&local_80,limit);
  Reverse_abi_cxx11_(&local_80,(leveldb *)limit,key);
  pCVar1 = BytewiseComparator();
  local_40._M_dataplus._M_p._0_4_ = local_80._M_dataplus._M_p._0_4_;
  local_40._M_dataplus._M_p._4_4_ = local_80._M_dataplus._M_p._4_4_;
  local_40._M_string_length._0_4_ = (undefined4)local_80._M_string_length;
  local_40._M_string_length._4_4_ = local_80._M_string_length._4_4_;
  (*pCVar1->_vptr_Comparator[4])(pCVar1,&local_60);
  local_20 = local_60._M_dataplus._M_p;
  sStack_18 = local_60._M_string_length;
  Reverse_abi_cxx11_(&local_40,(leveldb *)&local_20,key_00);
  std::__cxx11::string::operator=((string *)start,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_) !=
      &local_40.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FindShortestSeparator(std::string* start,
                             const Slice& limit) const override {
    std::string s = Reverse(*start);
    std::string l = Reverse(limit);
    BytewiseComparator()->FindShortestSeparator(&s, l);
    *start = Reverse(s);
  }